

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void OPN2_ChGenerate(ym3438_t *chip)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  short local_26;
  ushort local_24;
  short local_22;
  Bit16s sum;
  Bit16s add;
  Bit16s acc;
  Bit32u test_dac;
  Bit32u op;
  Bit32u channel;
  Bit32u slot;
  ym3438_t *chip_local;
  
  uVar4 = (chip->cycles + 0x12) % 0x18;
  uVar2 = chip->channel;
  uVar3 = uVar4 / 6;
  bVar1 = chip->mode_test_2c[5];
  local_22 = chip->ch_acc[uVar2];
  local_24 = (ushort)bVar1;
  if ((uVar3 == 0) && (bVar1 == 0)) {
    local_22 = 0;
  }
  if ((*(int *)((ulong)uVar3 * 0xc0 + 0x296560 + (ulong)chip->connect[uVar2] * 4) != 0) &&
     (bVar1 == 0)) {
    local_24 = local_24 + (chip->fm_out[uVar4] >> 5);
  }
  local_26 = local_22 + local_24;
  if (local_26 < 0x100) {
    if (local_26 < -0x100) {
      local_26 = -0x100;
    }
  }
  else {
    local_26 = 0xff;
  }
  if ((uVar3 == 0) || (bVar1 != 0)) {
    chip->ch_out[uVar2] = chip->ch_acc[uVar2];
  }
  chip->ch_acc[uVar2] = local_26;
  return;
}

Assistant:

void OPN2_ChGenerate(ym3438_t *chip)
{
    Bit32u slot = (chip->cycles + 18) % 24;
    Bit32u channel = chip->channel;
    Bit32u op = slot / 6;
    Bit32u test_dac = chip->mode_test_2c[5];
    Bit16s acc = chip->ch_acc[channel];
    Bit16s add = test_dac;
    Bit16s sum = 0;
    if (op == 0 && !test_dac)
    {
        acc = 0;
    }
    if (fm_algorithm[op][5][chip->connect[channel]] && !test_dac)
    {
        add += chip->fm_out[slot] >> 5;
    }
    sum = acc + add;
    /* Clamp */
    if (sum > 255)
    {
        sum = 255;
    }
    else if(sum < -256)
    {
        sum = -256;
    }

    if (op == 0 || test_dac)
    {
        chip->ch_out[channel] = chip->ch_acc[channel];
    }
    chip->ch_acc[channel] = sum;
}